

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CJumpConditionalStatement::Copy(CJumpConditionalStatement *this)

{
  TLogicOperator _operation;
  CJumpConditionalStatement *this_00;
  pointer pCVar1;
  long in_RSI;
  undefined1 local_50 [8];
  undefined1 local_48 [32];
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_28;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_20 [2];
  CJumpConditionalStatement *this_local;
  
  this_local = this;
  this_00 = (CJumpConditionalStatement *)operator_new(0x30);
  _operation = *(TLogicOperator *)(in_RSI + 0x28);
  pCVar1 = std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
           operator->((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)(in_RSI + 8));
  (*(pCVar1->super_IExpression).super_INode._vptr_INode[3])(&local_28);
  pCVar1 = std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
           operator->((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)(in_RSI + 0x10));
  (*(pCVar1->super_IExpression).super_INode._vptr_INode[3])(local_48 + 8);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  operator->((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)(in_RSI + 0x18));
  CLabelStatement::CastCopy((CLabelStatement *)local_48);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  operator->((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)(in_RSI + 0x20));
  CLabelStatement::CastCopy((CLabelStatement *)local_50);
  CJumpConditionalStatement
            (this_00,_operation,&local_28,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             (local_48 + 8),
             (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)local_48,
             (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)local_50);
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             local_20,(pointer)this_00);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)this,
             local_20);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (local_20);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
               *)local_50);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
               *)local_48);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            ((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             (local_48 + 8));
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_28);
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement> CJumpConditionalStatement::Copy( ) const {
    return std::move( std::unique_ptr<const CStatement>(
            new CJumpConditionalStatement( operation,
                                           leftOperand->Copy( ),
                                           rightOperand->Copy( ),
                                           labelTrue->CastCopy( ),
                                           labelFalse->CastCopy( ))));
}